

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

Var Js::RecyclableObjectWalker::GetObject
              (RecyclableObject *originalInstance,RecyclableObject *instance,PropertyId propertyId,
              ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  ScriptContext *this;
  Var error;
  JavascriptException *err;
  RecyclableObject *local_38;
  Var obj;
  ScriptContext *scriptContext_local;
  RecyclableObject *pRStack_20;
  PropertyId propertyId_local;
  RecyclableObject *instance_local;
  RecyclableObject *originalInstance_local;
  
  obj = scriptContext;
  scriptContext_local._4_4_ = propertyId;
  pRStack_20 = instance;
  instance_local = originalInstance;
  if (instance == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xad2,"(instance)","instance");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  BVar3 = IsInternalPropertyId(scriptContext_local._4_4_);
  if (BVar3 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xad3,"(!Js::IsInternalPropertyId(propertyId))",
                                "!Js::IsInternalPropertyId(propertyId)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  local_38 = (RecyclableObject *)0x0;
  BVar3 = RecyclableObjectDisplay::GetPropertyWithScriptEnter
                    (instance_local,pRStack_20,scriptContext_local._4_4_,&local_38,
                     (ScriptContext *)obj);
  if (BVar3 == 0) {
    this = RecyclableObject::GetScriptContext(pRStack_20);
    originalInstance_local = ScriptContext::GetMissingPropertyResult(this);
  }
  else {
    originalInstance_local = local_38;
  }
  return originalInstance_local;
}

Assistant:

Var RecyclableObjectWalker::GetObject(RecyclableObject* originalInstance, RecyclableObject* instance, PropertyId propertyId, ScriptContext* scriptContext)
    {
        Assert(instance);
        Assert(!Js::IsInternalPropertyId(propertyId));

        Var obj = nullptr;
        try
        {
            if (!RecyclableObjectDisplay::GetPropertyWithScriptEnter(originalInstance, instance, propertyId, &obj, scriptContext))
            {
                return instance->GetScriptContext()->GetMissingPropertyResult();
            }
        }
        catch(const JavascriptException& err)
        {
            Var error = err.GetAndClear()->GetThrownObject(instance->GetScriptContext());
            if (error != nullptr && Js::VarIs<Js::JavascriptError>(error))
            {
                obj = error;
            }
        }

        return obj;
    }